

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
testing::HasSubstr<char_const*>
          (PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,testing *this,StringLike<const_char_*> *substring)

{
  string local_60 [32];
  string local_40 [39];
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>(local_60,*(char **)this,&local_19);
  std::__cxx11::string::string(local_40,local_60);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  return __return_storage_ptr__;
}

Assistant:

PolymorphicMatcher<internal::HasSubstrMatcher<std::string> > HasSubstr(
    const internal::StringLike<T>& substring) {
  return MakePolymorphicMatcher(
      internal::HasSubstrMatcher<std::string>(std::string(substring)));
}